

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalGenerator.cxx
# Opt level: O3

void __thiscall cmGlobalGenerator::WriteSummary(cmGlobalGenerator *this,cmGeneratorTarget *target)

{
  pointer pcVar1;
  cmSourceFile *this_00;
  long *plVar2;
  pointer pbVar3;
  cmSourceFile **ppcVar4;
  char *pcVar5;
  cmMakefile *pcVar6;
  char *__s;
  Value *pVVar7;
  string *psVar8;
  Value *pVVar9;
  size_t sVar10;
  ostream *poVar11;
  __normal_iterator<cmSourceFile_**,_std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>_>
  _Var12;
  pointer ppcVar13;
  string *c;
  pointer pbVar14;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar15;
  string *label;
  string *value;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  labels;
  string json_file;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  configs;
  vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_> sources;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  cmakeDirectoryLabelsList;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  directoryLabelsList;
  string file;
  string dir;
  Value lj_root;
  cmGeneratedFileStream json_fout;
  cmGeneratedFileStream fout;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_6f8;
  cmSourceFile **local_6e0;
  string local_6d8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_6b8;
  vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_> local_698;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_678;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_658;
  string local_640;
  Value *local_620;
  string local_618;
  Value local_5f8;
  Value local_5d0;
  Value local_5a8;
  Value local_580;
  Value local_558;
  ValueHolder local_530 [2];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_520 [35];
  string local_2e8;
  Value local_2c8;
  Value local_2a0;
  undefined1 local_278 [584];
  
  cmGeneratorTarget::GetSupportDirectory_abi_cxx11_(&local_618,target);
  local_640._M_dataplus._M_p = (pointer)&local_640.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_640,local_618._M_dataplus._M_p,
             local_618._M_dataplus._M_p + local_618._M_string_length);
  std::__cxx11::string::append((char *)&local_640);
  local_6d8._M_dataplus._M_p = (pointer)&local_6d8.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_6d8,local_618._M_dataplus._M_p,
             local_618._M_dataplus._M_p + local_618._M_string_length);
  std::__cxx11::string::append((char *)&local_6d8);
  pcVar1 = local_278 + 0x10;
  local_278._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_278,"LABELS","");
  pcVar5 = cmGeneratorTarget::GetProperty(target,(string *)local_278);
  if ((pointer)local_278._0_8_ != pcVar1) {
    operator_delete((void *)local_278._0_8_,local_278._16_8_ + 1);
  }
  pcVar6 = cmTarget::GetMakefile(target->Target);
  local_278._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_278,"LABELS","");
  local_6e0 = (cmSourceFile **)cmMakefile::GetProperty(pcVar6,(string *)local_278);
  if ((pointer)local_278._0_8_ != pcVar1) {
    operator_delete((void *)local_278._0_8_,local_278._16_8_ + 1);
  }
  pcVar6 = cmTarget::GetMakefile(target->Target);
  local_278._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_278,"CMAKE_DIRECTORY_LABELS","");
  __s = cmMakefile::GetDefinition(pcVar6,(string *)local_278);
  if ((pointer)local_278._0_8_ != pcVar1) {
    operator_delete((void *)local_278._0_8_,local_278._16_8_ + 1);
  }
  if ((pcVar5 == (char *)0x0 && local_6e0 == (cmSourceFile **)0x0) && __s == (char *)0x0) {
    cmsys::SystemTools::RemoveFile(&local_640);
    cmsys::SystemTools::RemoveFile(&local_6d8);
  }
  else {
    Json::Value::Value(&local_5f8,objectValue);
    Json::Value::Value(&local_558,objectValue);
    pVVar7 = Json::Value::operator[](&local_5f8,"target");
    pVVar7 = Json::Value::operator=(pVVar7,&local_558);
    Json::Value::~Value(&local_558);
    psVar8 = cmGeneratorTarget::GetName_abi_cxx11_(target);
    Json::Value::Value(&local_580,psVar8);
    pVVar9 = Json::Value::operator[](pVVar7,"name");
    Json::Value::operator=(pVVar9,&local_580);
    Json::Value::~Value(&local_580);
    Json::Value::Value(&local_5a8,arrayValue);
    pVVar7 = Json::Value::operator[](pVVar7,"labels");
    pVVar7 = Json::Value::operator=(pVVar7,&local_5a8);
    Json::Value::~Value(&local_5a8);
    Json::Value::Value(&local_5d0,arrayValue);
    pVVar9 = Json::Value::operator[](&local_5f8,"sources");
    local_620 = Json::Value::operator=(pVVar9,&local_5d0);
    Json::Value::~Value(&local_5d0);
    cmsys::SystemTools::MakeDirectory(&local_618,(mode_t *)0x0);
    cmGeneratedFileStream::cmGeneratedFileStream
              ((cmGeneratedFileStream *)local_278,&local_640,false,None);
    local_6f8.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (string *)0x0;
    local_6f8.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (string *)0x0;
    local_6f8.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    if (pcVar5 != (char *)0x0) {
      local_530[0].string_ = (char *)local_520;
      sVar10 = strlen(pcVar5);
      std::__cxx11::string::_M_construct<char_const*>((string *)local_530,pcVar5,pcVar5 + sVar10);
      cmSystemTools::ExpandListArgument((string *)local_530,&local_6f8,false);
      if (local_530[0] != local_520) {
        operator_delete(local_530[0].string_,local_520[0]._M_allocated_capacity + 1);
      }
      if ((local_6f8.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start !=
           local_6f8.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish) &&
         (std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_278,"# Target labels\n",0x10),
         pbVar3 = local_6f8.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish,
         local_6f8.
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start !=
         local_6f8.
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl.super__Vector_impl_data._M_finish)) {
        pbVar14 = local_6f8.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        do {
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_278," ",1);
          poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_278,(pbVar14->_M_dataplus)._M_p,
                               pbVar14->_M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar11,"\n",1);
          Json::Value::Value((Value *)local_530,pbVar14);
          Json::Value::append(pVVar7,(Value *)local_530);
          Json::Value::~Value((Value *)local_530);
          pbVar14 = pbVar14 + 1;
        } while (pbVar14 != pbVar3);
      }
    }
    ppcVar4 = local_6e0;
    local_658.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (string *)0x0;
    local_658.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (string *)0x0;
    local_658.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_678.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_678.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (string *)0x0;
    local_678.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (string *)0x0;
    if (local_6e0 != (cmSourceFile **)0x0) {
      local_530[0].string_ = (char *)local_520;
      sVar10 = strlen((char *)local_6e0);
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_530,ppcVar4,(long)ppcVar4 + sVar10);
      cmSystemTools::ExpandListArgument((string *)local_530,&local_658,false);
      if (local_530[0] != local_520) {
        operator_delete(local_530[0].string_,local_520[0]._M_allocated_capacity + 1);
      }
    }
    if (__s != (char *)0x0) {
      local_530[0].string_ = (char *)local_520;
      sVar10 = strlen(__s);
      std::__cxx11::string::_M_construct<char_const*>((string *)local_530,__s,__s + sVar10);
      cmSystemTools::ExpandListArgument((string *)local_530,&local_678,false);
      if (local_530[0] != local_520) {
        operator_delete(local_530[0].string_,local_520[0]._M_allocated_capacity + 1);
      }
    }
    if (((local_658.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start !=
          local_658.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish) ||
        (local_678.
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start !=
         local_678.
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl.super__Vector_impl_data._M_finish)) &&
       (std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_278,"# Directory labels\n",0x13),
       pbVar3 = local_658.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish,
       local_658.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start !=
       local_658.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish)) {
      pbVar14 = local_658.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      do {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_278," ",1);
        poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_278,(pbVar14->_M_dataplus)._M_p,
                             pbVar14->_M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar11,"\n",1);
        Json::Value::Value((Value *)local_530,pbVar14);
        Json::Value::append(pVVar7,(Value *)local_530);
        Json::Value::~Value((Value *)local_530);
        pbVar14 = pbVar14 + 1;
      } while (pbVar14 != pbVar3);
    }
    pbVar3 = local_678.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (local_678.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        local_678.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      pbVar14 = local_678.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      do {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_278," ",1);
        poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_278,(pbVar14->_M_dataplus)._M_p,
                             pbVar14->_M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar11,"\n",1);
        Json::Value::Value((Value *)local_530,pbVar14);
        Json::Value::append(pVVar7,(Value *)local_530);
        Json::Value::~Value((Value *)local_530);
        pbVar14 = pbVar14 + 1;
      } while (pbVar14 != pbVar3);
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_278,"# Source files and their labels\n",0x20);
    local_698.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
    super__Vector_impl_data._M_start = (cmSourceFile **)0x0;
    local_698.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
    super__Vector_impl_data._M_finish = (cmSourceFile **)0x0;
    local_698.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_6b8.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_6b8.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (string *)0x0;
    local_6b8.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (string *)0x0;
    pcVar6 = cmTarget::GetMakefile(target->Target);
    cmMakefile::GetConfigurations(&local_2e8,pcVar6,&local_6b8,true);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2e8._M_dataplus._M_p != &local_2e8.field_2) {
      operator_delete(local_2e8._M_dataplus._M_p,local_2e8.field_2._M_allocated_capacity + 1);
    }
    if (local_6b8.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start ==
        local_6b8.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::emplace_back<>(&local_6b8);
    }
    pbVar3 = local_6b8.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (local_6b8.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        local_6b8.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      pbVar14 = local_6b8.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      do {
        cmGeneratorTarget::GetSourceFiles(target,&local_698,pbVar14);
        pbVar14 = pbVar14 + 1;
      } while (pbVar14 != pbVar3);
    }
    _Var12 = cmRemoveDuplicates<__gnu_cxx::__normal_iterator<cmSourceFile**,std::vector<cmSourceFile*,std::allocator<cmSourceFile*>>>>
                       ((__normal_iterator<cmSourceFile_**,_std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>_>
                         )local_698.
                          super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>.
                          _M_impl.super__Vector_impl_data._M_start,
                        (__normal_iterator<cmSourceFile_**,_std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>_>
                         )local_698.
                          super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>.
                          _M_impl.super__Vector_impl_data._M_finish);
    if (local_698.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
        super__Vector_impl_data._M_start != _Var12._M_current) {
      ppcVar13 = local_698.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>.
                 _M_impl.super__Vector_impl_data._M_start;
      local_6e0 = _Var12._M_current;
      do {
        this_00 = *ppcVar13;
        Json::Value::Value((Value *)local_530,objectValue);
        pVVar7 = Json::Value::append(local_620,(Value *)local_530);
        Json::Value::~Value((Value *)local_530);
        psVar8 = cmSourceFile::GetFullPath(this_00,(string *)0x0);
        poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_278,(psVar8->_M_dataplus)._M_p,
                             psVar8->_M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar11,"\n",1);
        Json::Value::Value(&local_2a0,psVar8);
        pVVar9 = Json::Value::operator[](pVVar7,"file");
        Json::Value::operator=(pVVar9,&local_2a0);
        Json::Value::~Value(&local_2a0);
        local_530[0].string_ = (char *)local_520;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_530,"LABELS","");
        pcVar5 = cmSourceFile::GetProperty(this_00,(string *)local_530);
        if (local_530[0] != local_520) {
          operator_delete(local_530[0].string_,local_520[0]._M_allocated_capacity + 1);
        }
        pbVar14 = local_6f8.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
        pbVar3 = local_6f8.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        if (pcVar5 != (char *)0x0) {
          if (local_6f8.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish !=
              local_6f8.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start) {
            paVar15 = &(local_6f8.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start)->field_2;
            do {
              plVar2 = (long *)(((string *)(paVar15 + -1))->_M_dataplus)._M_p;
              if (paVar15 !=
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)plVar2) {
                operator_delete(plVar2,paVar15->_M_allocated_capacity + 1);
              }
              psVar8 = (string *)(paVar15 + 1);
              paVar15 = paVar15 + 2;
            } while (psVar8 != pbVar14);
            local_6f8.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish = pbVar3;
          }
          Json::Value::Value(&local_2c8,arrayValue);
          pVVar7 = Json::Value::operator[](pVVar7,"labels");
          _Var12._M_current = local_6e0;
          pVVar7 = Json::Value::operator=(pVVar7,&local_2c8);
          Json::Value::~Value(&local_2c8);
          local_530[0].string_ = (char *)local_520;
          sVar10 = strlen(pcVar5);
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_530,pcVar5,pcVar5 + sVar10);
          cmSystemTools::ExpandListArgument((string *)local_530,&local_6f8,false);
          value = local_6f8.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
          psVar8 = local_6f8.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
          if (local_530[0] != local_520) {
            operator_delete(local_530[0].string_,local_520[0]._M_allocated_capacity + 1);
            value = local_6f8.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
            psVar8 = local_6f8.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
          }
          for (; value != psVar8; value = value + 1) {
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_278," ",1);
            poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_278,(value->_M_dataplus)._M_p,
                                 value->_M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>(poVar11,"\n",1);
            Json::Value::Value((Value *)local_530,value);
            Json::Value::append(pVVar7,(Value *)local_530);
            Json::Value::~Value((Value *)local_530);
          }
        }
        ppcVar13 = ppcVar13 + 1;
      } while (ppcVar13 != _Var12._M_current);
    }
    cmGeneratedFileStream::cmGeneratedFileStream
              ((cmGeneratedFileStream *)local_530,&local_6d8,false,None);
    Json::operator<<((ostream *)local_530,&local_5f8);
    cmGeneratedFileStream::~cmGeneratedFileStream((cmGeneratedFileStream *)local_530);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_6b8);
    if (local_698.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
        super__Vector_impl_data._M_start != (cmSourceFile **)0x0) {
      operator_delete(local_698.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_698.
                            super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_698.
                            super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_678);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_658);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_6f8);
    cmGeneratedFileStream::~cmGeneratedFileStream((cmGeneratedFileStream *)local_278);
    Json::Value::~Value(&local_5f8);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_6d8._M_dataplus._M_p != &local_6d8.field_2) {
    operator_delete(local_6d8._M_dataplus._M_p,local_6d8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_640._M_dataplus._M_p != &local_640.field_2) {
    operator_delete(local_640._M_dataplus._M_p,local_640.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_618._M_dataplus._M_p != &local_618.field_2) {
    operator_delete(local_618._M_dataplus._M_p,local_618.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void cmGlobalGenerator::WriteSummary(cmGeneratorTarget* target)
{
  // Place the labels file in a per-target support directory.
  std::string dir = target->GetSupportDirectory();
  std::string file = dir;
  file += "/Labels.txt";
  std::string json_file = dir + "/Labels.json";

#ifdef CMAKE_BUILD_WITH_CMAKE
  // Check whether labels are enabled for this target.
  const char* targetLabels = target->GetProperty("LABELS");
  const char* directoryLabels =
    target->Target->GetMakefile()->GetProperty("LABELS");
  const char* cmakeDirectoryLabels =
    target->Target->GetMakefile()->GetDefinition("CMAKE_DIRECTORY_LABELS");
  if (targetLabels || directoryLabels || cmakeDirectoryLabels) {
    Json::Value lj_root(Json::objectValue);
    Json::Value& lj_target = lj_root["target"] = Json::objectValue;
    lj_target["name"] = target->GetName();
    Json::Value& lj_target_labels = lj_target["labels"] = Json::arrayValue;
    Json::Value& lj_sources = lj_root["sources"] = Json::arrayValue;

    cmSystemTools::MakeDirectory(dir);
    cmGeneratedFileStream fout(file);

    std::vector<std::string> labels;

    // List the target-wide labels.  All sources in the target get
    // these labels.
    if (targetLabels) {
      cmSystemTools::ExpandListArgument(targetLabels, labels);
      if (!labels.empty()) {
        fout << "# Target labels\n";
        for (std::string const& l : labels) {
          fout << " " << l << "\n";
          lj_target_labels.append(l);
        }
      }
    }

    // List directory labels
    std::vector<std::string> directoryLabelsList;
    std::vector<std::string> cmakeDirectoryLabelsList;

    if (directoryLabels) {
      cmSystemTools::ExpandListArgument(directoryLabels, directoryLabelsList);
    }

    if (cmakeDirectoryLabels) {
      cmSystemTools::ExpandListArgument(cmakeDirectoryLabels,
                                        cmakeDirectoryLabelsList);
    }

    if (!directoryLabelsList.empty() || !cmakeDirectoryLabelsList.empty()) {
      fout << "# Directory labels\n";
    }

    for (std::string const& li : directoryLabelsList) {
      fout << " " << li << "\n";
      lj_target_labels.append(li);
    }

    for (std::string const& li : cmakeDirectoryLabelsList) {
      fout << " " << li << "\n";
      lj_target_labels.append(li);
    }

    // List the source files with any per-source labels.
    fout << "# Source files and their labels\n";
    std::vector<cmSourceFile*> sources;
    std::vector<std::string> configs;
    target->Target->GetMakefile()->GetConfigurations(configs);
    if (configs.empty()) {
      configs.emplace_back();
    }
    for (std::string const& c : configs) {
      target->GetSourceFiles(sources, c);
    }
    auto const sourcesEnd = cmRemoveDuplicates(sources);
    for (cmSourceFile* sf : cmMakeRange(sources.cbegin(), sourcesEnd)) {
      Json::Value& lj_source = lj_sources.append(Json::objectValue);
      std::string const& sfp = sf->GetFullPath();
      fout << sfp << "\n";
      lj_source["file"] = sfp;
      if (const char* svalue = sf->GetProperty("LABELS")) {
        labels.clear();
        Json::Value& lj_source_labels = lj_source["labels"] = Json::arrayValue;
        cmSystemTools::ExpandListArgument(svalue, labels);
        for (std::string const& label : labels) {
          fout << " " << label << "\n";
          lj_source_labels.append(label);
        }
      }
    }
    cmGeneratedFileStream json_fout(json_file);
    json_fout << lj_root;
  } else
#endif
  {
    cmSystemTools::RemoveFile(file);
    cmSystemTools::RemoveFile(json_file);
  }
}